

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O0

ssize_t filemgr_write_blocks(filemgr *file,void *buf,uint num_blocks,bid_t start_bid)

{
  undefined4 uVar1;
  code *pcVar2;
  undefined1 *puVar3;
  uint8_t *puVar4;
  size_t sVar5;
  bid_t *pbVar6;
  undefined1 auStack_58 [4];
  fdb_status local_54;
  undefined1 *puStack_50;
  fdb_status status;
  uint8_t *encrypted_buf;
  size_t nbytes;
  cs_off_t offset;
  size_t blocksize;
  bid_t start_bid_local;
  void *pvStack_20;
  uint num_blocks_local;
  void *buf_local;
  filemgr *file_local;
  
  pbVar6 = (bid_t *)auStack_58;
  buf_local = file;
  pvStack_20 = buf;
  start_bid_local._4_4_ = num_blocks;
  blocksize = start_bid;
  offset = (cs_off_t)file->blocksize;
  nbytes = start_bid * offset;
  encrypted_buf = (uint8_t *)((ulong)num_blocks * offset);
  if ((file->encryption).ops == (encryption_ops *)0x0) {
    file_local = (filemgr *)
                 (*file->ops->pwrite)(file->fd,buf,(size_t)encrypted_buf,start_bid * offset);
  }
  else {
    if (encrypted_buf < (uint8_t *)0x1001) {
      pbVar6 = (bid_t *)(auStack_58 + -((ulong)(encrypted_buf + 0xf) & 0xfffffffffffffff0));
      puStack_50 = (undefined1 *)pbVar6;
    }
    else {
      puStack_50 = (undefined1 *)malloc((size_t)encrypted_buf);
    }
    if (puStack_50 == (undefined1 *)0x0) {
      file_local = (filemgr *)0xfffffffffffffff8;
    }
    else {
      pbVar6[-1] = 0x13677d;
      local_54 = fdb_encrypt_blocks((encryptor *)pbVar6[5],(void *)pbVar6[4],(void *)pbVar6[3],
                                    pbVar6[2],*(uint *)((long)pbVar6 + 0xc),*pbVar6);
      puVar3 = puStack_50;
      if ((uint8_t *)0x1000 < encrypted_buf) {
        pbVar6[-1] = 0x136793;
        free(puVar3);
      }
      sVar5 = nbytes;
      puVar4 = encrypted_buf;
      puVar3 = puStack_50;
      if (local_54 == FDB_RESULT_SUCCESS) {
        pcVar2 = *(code **)(*(long *)((long)buf_local + 0xe8) + 8);
        uVar1 = *(undefined4 *)((long)buf_local + 0x14);
        pbVar6[-1] = 0x1367c7;
        file_local = (filemgr *)(*pcVar2)(uVar1,puVar3,puVar4,sVar5);
      }
      else {
        file_local = (filemgr *)(long)local_54;
      }
    }
  }
  return (ssize_t)file_local;
}

Assistant:

ssize_t filemgr_write_blocks(struct filemgr *file, void *buf, unsigned num_blocks, bid_t start_bid) {
    size_t blocksize = file->blocksize;
    cs_off_t offset = start_bid * blocksize;
    size_t nbytes = num_blocks * blocksize;
    if (file->encryption.ops == NULL) {
        return file->ops->pwrite(file->fd, buf, nbytes, offset);
    } else {
        uint8_t *encrypted_buf;
        if (nbytes > 4096)
            encrypted_buf = (uint8_t*)malloc(nbytes);
        else
            encrypted_buf = alca(uint8_t, nbytes); // most common case (writing single block)
        if (!encrypted_buf)
            return FDB_RESULT_ALLOC_FAIL;
        fdb_status status = fdb_encrypt_blocks(&file->encryption,
                                               encrypted_buf,
                                               buf,
                                               blocksize,
                                               num_blocks,
                                               start_bid);
        if (nbytes > 4096)
            free(encrypted_buf);
        if (status != FDB_RESULT_SUCCESS)
            return status;
        return file->ops->pwrite(file->fd, encrypted_buf, nbytes, offset);
    }
}